

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

optional<tinyusdz::Prim> *
tinyusdz::detail::ReconstructPrimFromPrimSpec
          (optional<tinyusdz::Prim> *__return_storage_ptr__,PrimSpec *primspec,string *warn,
          string *err)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  Prim prim;
  Model typed_prim;
  storage_union local_4d18;
  long local_4d08;
  undefined1 local_4cf8 [848];
  undefined1 local_49a8 [160];
  string local_4908 [32];
  storage_t<double> local_48e8 [5];
  string local_48c0 [1752];
  undefined1 local_41e8 [568];
  string local_3fb0 [16];
  undefined1 local_3fa0 [32];
  undefined1 local_3f80 [112];
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_3f10 [6];
  undefined1 local_3df0 [3152];
  undefined1 local_31a0 [704];
  undefined1 local_2ee0 [11952];
  
  __lhs = &primspec->_typeName;
  bVar1 = ::std::operator==(__lhs,"Model");
  if (bVar1) {
    Model::Model((Model *)local_49a8);
    local_4cf8[0] = false;
    bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                      (primspec,(Model *)local_49a8,warn,err,(PrimReconstructOptions *)local_4cf8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x47c);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Model");
      ::std::operator<<(poVar3,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
LAB_00173adb:
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
      goto LAB_00173af1;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,&primspec->_metas);
    ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
    ::std::__cxx11::string::_M_assign(local_3fb0);
    local_3fa0._16_4_ = primspec->_specifier;
    linb::any::construct<tinyusdz::Model_const&>((any *)&local_4d18,(Model *)local_49a8);
    Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
    ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
    nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
              (__return_storage_ptr__,(Prim *)local_4cf8);
    Prim::~Prim((Prim *)local_4cf8);
  }
  else {
    tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
    _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_49a8);
    ::std::__cxx11::string::_M_dispose();
    if (_Var2) {
      GPrim::GPrim((GPrim *)local_49a8);
      local_4cf8[0] = false;
      bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                        (primspec,(Xform *)local_49a8,warn,err,(PrimReconstructOptions *)local_4cf8)
      ;
      if (bVar1) {
        PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
        ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
        local_3f10[0]._0_4_ = primspec->_specifier;
        linb::any::construct<tinyusdz::Xform_const&>((any *)&local_4d18,(Xform *)local_49a8);
        Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
        ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
        nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                  (__return_storage_ptr__,(Prim *)local_4cf8);
        Prim::~Prim((Prim *)local_4cf8);
        if (local_4d08 != 0) {
          (**(code **)(local_4d08 + 0x20))(&local_4d18);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
        poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x48d);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec "
                                  );
        poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
        poVar3 = ::std::operator<<(poVar3," elementName: ");
        poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
        ::std::operator<<(poVar3,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
        __return_storage_ptr__->has_value_ = false;
        memset(&__return_storage_ptr__->contained,0,0x350);
      }
      GPrim::~GPrim((GPrim *)local_49a8);
      return __return_storage_ptr__;
    }
    tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
    _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_49a8);
    ::std::__cxx11::string::_M_dispose();
    if (!_Var2) {
      tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        Scope::Scope((Scope *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
                          (primspec,(Scope *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_3fa0,&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
          local_3fb0._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::Scope_const&>((any *)&local_4d18,(Scope *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x48f);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Scope::~Scope((Scope *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomMesh::GeomMesh((GeomMesh *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomMesh>
                          (primspec,(GeomMesh *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomMesh_const&>((any *)&local_4d18,(GeomMesh *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x490);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomMesh::~GeomMesh((GeomMesh *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomPoints>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomPoints::GeomPoints((GeomPoints *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
                          (primspec,(GeomPoints *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomPoints_const&>
                    ((any *)&local_4d18,(GeomPoints *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x491);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomPoints::~GeomPoints((GeomPoints *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCylinder>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomCylinder::GeomCylinder((GeomCylinder *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCylinder>
                          (primspec,(GeomCylinder *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomCylinder_const&>
                    ((any *)&local_4d18,(GeomCylinder *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x492);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCylinder::~GeomCylinder((GeomCylinder *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCube>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomCube::GeomCube((GeomCube *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCube>
                          (primspec,(GeomCube *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomCube_const&>((any *)&local_4d18,(GeomCube *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x493);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCube::~GeomCube((GeomCube *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCone>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomCone::GeomCone((GeomCone *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCone>
                          (primspec,(GeomCone *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomCone_const&>((any *)&local_4d18,(GeomCone *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x494);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCone::~GeomCone((GeomCone *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomSphere>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomSphere::GeomSphere((GeomSphere *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSphere>
                          (primspec,(GeomSphere *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomSphere_const&>
                    ((any *)&local_4d18,(GeomSphere *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x495);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomSphere::~GeomSphere((GeomSphere *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCapsule>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomCapsule::GeomCapsule((GeomCapsule *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCapsule>
                          (primspec,(GeomCapsule *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomCapsule_const&>
                    ((any *)&local_4d18,(GeomCapsule *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x496);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCapsule::~GeomCapsule((GeomCapsule *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomBasisCurves>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomBasisCurves::GeomBasisCurves((GeomBasisCurves *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomBasisCurves>
                          (primspec,(GeomBasisCurves *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomBasisCurves_const&>
                    ((any *)&local_4d18,(GeomBasisCurves *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x497);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomBasisCurves::~GeomBasisCurves((GeomBasisCurves *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::GeomCamera>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        GeomCamera::GeomCamera((GeomCamera *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
                          (primspec,(GeomCamera *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_31a0 + 0x208),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)(local_3f80 + 0x50));
          local_3f10[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::GeomCamera_const&>
                    ((any *)&local_4d18,(GeomCamera *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x498);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        GeomCamera::~GeomCamera((GeomCamera *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SphereLight>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        SphereLight::SphereLight((SphereLight *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::SphereLight>
                          (primspec,(SphereLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::SphereLight_const&>
                    ((any *)&local_4d18,(SphereLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49a);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SphereLight::~SphereLight((SphereLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DomeLight>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        DomeLight::DomeLight((DomeLight *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
                          (primspec,(DomeLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::DomeLight_const&>
                    ((any *)&local_4d18,(DomeLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49b);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DomeLight::~DomeLight((DomeLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::CylinderLight>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        CylinderLight::CylinderLight((CylinderLight *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::CylinderLight>
                          (primspec,(CylinderLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::CylinderLight_const&>
                    ((any *)&local_4d18,(CylinderLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49c);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        CylinderLight::~CylinderLight((CylinderLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DiskLight>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        DiskLight::DiskLight((DiskLight *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::DiskLight>
                          (primspec,(DiskLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_2ee0 + 0x278),&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::DiskLight_const&>
                    ((any *)&local_4d18,(DiskLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49d);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DiskLight::~DiskLight((DiskLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::DistantLight>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        DistantLight::DistantLight((DistantLight *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
                          (primspec,(DistantLight *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_2ee0,&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_48c0);
          local_48c0._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::DistantLight_const&>
                    ((any *)&local_4d18,(DistantLight *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49e);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        DistantLight::~DistantLight((DistantLight *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SkelRoot>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        SkelRoot::SkelRoot((SkelRoot *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::SkelRoot>
                          (primspec,(SkelRoot *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_3df0,&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::SkelRoot_const&>((any *)&local_4d18,(SkelRoot *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x49f);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelRoot::~SkelRoot((SkelRoot *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Skeleton>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        Skeleton::Skeleton((Skeleton *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Skeleton>
                          (primspec,(Skeleton *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_31a0,&primspec->_metas);
          ::std::__cxx11::string::_M_assign(local_4908);
          local_48e8[0]._0_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::Skeleton_const&>((any *)&local_4d18,(Skeleton *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a0);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Skeleton::~Skeleton((Skeleton *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::SkelAnimation>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        SkelAnimation::SkelAnimation((SkelAnimation *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
                          (primspec,(SkelAnimation *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_3df0 + 0x398),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::SkelAnimation_const&>
                    ((any *)&local_4d18,(SkelAnimation *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a1);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        SkelAnimation::~SkelAnimation((SkelAnimation *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::BlendShape>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        BlendShape::BlendShape((BlendShape *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
                          (primspec,(BlendShape *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)local_41e8,&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::BlendShape_const&>
                    ((any *)&local_4d18,(BlendShape *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a2);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        BlendShape::~BlendShape((BlendShape *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Shader>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        Shader::Shader((Shader *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
                          (primspec,(Shader *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_49a8 + 0x30),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::Shader_const&>((any *)&local_4d18,(Shader *)local_49a8);
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a3);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Shader::~Shader((Shader *)local_49a8);
        return __return_storage_ptr__;
      }
      tinyusdz::value::TypeTraits<tinyusdz::Material>::type_name_abi_cxx11_();
      _Var2 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_49a8);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        Material::Material((Material *)local_49a8);
        local_4cf8[0] = false;
        bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
                          (primspec,(Material *)local_49a8,warn,err,
                           (PrimReconstructOptions *)local_4cf8);
        if (bVar1) {
          PrimMetas::operator=((PrimMetas *)(local_49a8 + 0x30),&primspec->_metas);
          ::std::__cxx11::string::_M_assign((string *)local_49a8);
          local_49a8._32_4_ = primspec->_specifier;
          linb::any::construct<tinyusdz::Material_const&>((any *)&local_4d18,(Material *)local_49a8)
          ;
          Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
          ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
          nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
                    (__return_storage_ptr__,(Prim *)local_4cf8);
          Prim::~Prim((Prim *)local_4cf8);
          if (local_4d08 != 0) {
            (**(code **)(local_4d08 + 0x20))(&local_4d18);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
          poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a4);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_4cf8,
                                     "Failed to reconstruct Prim from PrimSpec ");
          poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
          poVar3 = ::std::operator<<(poVar3," elementName: ");
          poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
          ::std::operator<<(poVar3,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
          __return_storage_ptr__->has_value_ = false;
          memset(&__return_storage_ptr__->contained,0,0x350);
        }
        Material::~Material((Material *)local_49a8);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_49a8);
      poVar3 = ::std::operator<<((ostream *)local_49a8,"[warn]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x4a5);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_49a8,"TODO or unsupported prim type: ");
      poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
      ::std::operator<<(poVar3,"\n");
      if (warn != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)warn);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_49a8);
      __return_storage_ptr__->has_value_ = false;
      memset(&__return_storage_ptr__->contained,0,0x350);
      return __return_storage_ptr__;
    }
    Model::Model((Model *)local_49a8);
    local_4cf8[0] = false;
    bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Model>
                      (primspec,(Model *)local_49a8,warn,err,(PrimReconstructOptions *)local_4cf8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4cf8);
      poVar3 = ::std::operator<<((ostream *)local_4cf8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReconstructPrimFromPrimSpec");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x48e);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_4cf8,"Failed to reconstruct Prim from PrimSpec ");
      poVar3 = ::std::operator<<(poVar3,(string *)__lhs);
      poVar3 = ::std::operator<<(poVar3," elementName: ");
      poVar3 = ::std::operator<<(poVar3,(string *)&primspec->_name);
      ::std::operator<<(poVar3,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4cf8);
      goto LAB_00173adb;
    }
    PrimMetas::operator=((PrimMetas *)local_3f80,&primspec->_metas);
    ::std::__cxx11::string::_M_assign((string *)(local_41e8 + 0x218));
    local_3fa0._16_4_ = primspec->_specifier;
    linb::any::construct<tinyusdz::Model_const&>((any *)&local_4d18,(Model *)local_49a8);
    Prim::Prim((Prim *)local_4cf8,&primspec->_name,(Value *)&local_4d18);
    ::std::__cxx11::string::_M_assign((string *)(local_4cf8 + 0x270));
    nonstd::optional_lite::optional<tinyusdz::Prim>::optional<tinyusdz::Prim,_0>
              (__return_storage_ptr__,(Prim *)local_4cf8);
    Prim::~Prim((Prim *)local_4cf8);
  }
  if (local_4d08 != 0) {
    (**(code **)(local_4d08 + 0x20))(&local_4d18);
  }
LAB_00173af1:
  Model::~Model((Model *)local_49a8);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Prim> ReconstructPrimFromPrimSpec(
    const PrimSpec &primspec, std::string *warn, std::string *err) {
  (void)warn;

  // TODO:
  // - propertyNames()
  // - primChildrenNames()

#define RECONSTRUCT_PRIM(__primty)                                       \
  if (primspec.typeName() == value::TypeTraits<__primty>::type_name()) { \
    __primty typed_prim;                                                 \
    if (!prim::ReconstructPrim(primspec, &typed_prim, warn, err)) {      \
      PUSH_ERROR("Failed to reconstruct Prim from PrimSpec "             \
                 << primspec.typeName()                                  \
                 << " elementName: " << primspec.name());                \
      return nonstd::nullopt;                                            \
    }                                                                    \
    typed_prim.meta = primspec.metas();                                  \
    typed_prim.name = primspec.name();                                   \
    typed_prim.spec = primspec.specifier();                              \
    /*typed_prim.propertyNames() = properties; */                        \
    /*typed_prim.primChildrenNames() = primChildren;*/                   \
    value::Value primdata = typed_prim;                                  \
    Prim prim(primspec.name(), primdata);                                \
    prim.prim_type_name() = primspec.typeName();                         \
    /* also add primChildren to Prim */                                  \
    /* prim.metas().primChildren = primChildren; */                      \
    return std::move(prim);                                              \
  }